

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O1

void __thiscall
boost::detail::function::
void_function_obj_invoker1<boost::_bi::bind_t<void,_void_(*)(int_&,_int),_boost::_bi::list2<boost::arg<1>,_boost::_bi::value<int>_>_>,_void,_int_&>
::invoke(void_function_obj_invoker1<boost::_bi::bind_t<void,_void_(*)(int_&,_int),_boost::_bi::list2<boost::arg<1>,_boost::_bi::value<int>_>_>,_void,_int_&>
         *this,function_buffer *function_obj_ptr,int *a0)

{
  bind_t<void,_void_(*)(int_&,_int),_boost::_bi::list2<boost::arg<1>,_boost::_bi::value<int>_>_> *f;
  
  (**(code **)this)(function_obj_ptr,*(undefined4 *)(this + 8),a0,*(code **)this);
  return;
}

Assistant:

static BOOST_FUNCTION_VOID_RETURN_TYPE
        invoke(function_buffer& function_obj_ptr BOOST_FUNCTION_COMMA
               BOOST_FUNCTION_PARMS)

        {
          FunctionObj* f;
          if (function_allows_small_object_optimization<FunctionObj>::value)
            f = reinterpret_cast<FunctionObj*>(function_obj_ptr.data);
          else
            f = reinterpret_cast<FunctionObj*>(function_obj_ptr.members.obj_ptr);
          BOOST_FUNCTION_RETURN((*f)(BOOST_FUNCTION_ARGS));
        }